

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ports.cpp
# Opt level: O0

bool __thiscall rtosc::Port_Matcher::rtosc_match_args(Port_Matcher *this,char *pattern,char *msg)

{
  char *msg_00;
  Port_Matcher *this_00;
  char *in_RDX;
  char *in_RSI;
  bool bVar1;
  bool arg_match;
  char *arg_str;
  bool local_39;
  bool local_29;
  bool local_1;
  
  this_00 = (Port_Matcher *)(in_RSI + 1);
  if (*in_RSI == ':') {
    msg_00 = rtosc_argument_string(in_RDX);
    local_39 = true;
    if (*(char *)&this_00->m_enump == '\0') {
      local_39 = *(char *)&this_00->m_enump == *msg_00;
    }
    local_29 = local_39;
    while( true ) {
      bVar1 = false;
      if (*(char *)&this_00->m_enump != '\0') {
        bVar1 = *(char *)&this_00->m_enump != ':';
      }
      if (!bVar1) break;
      local_29 = (local_29 & *(char *)&this_00->m_enump == *msg_00) != 0;
      msg_00 = msg_00 + 1;
      this_00 = (Port_Matcher *)((long)&this_00->m_enump + 1);
    }
    if (*(char *)&this_00->m_enump == ':') {
      if ((local_29 == false) || (*msg_00 != '\0')) {
        local_1 = rtosc_match_args(this_00,in_RDX,msg_00);
      }
      else {
        local_1 = true;
      }
    }
    else {
      local_1 = local_29;
    }
  }
  else {
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool rtosc_match_args(const char *pattern, const char *msg)
        {
            //match anything if no arg restriction is present
            //(ie the ':')
            if(*pattern++ != ':')
                return true;

            const char *arg_str = rtosc_argument_string(msg);
            bool      arg_match = *pattern || *pattern == *arg_str;

            while(*pattern && *pattern != ':')
                arg_match &= (*pattern++==*arg_str++);

            if(*pattern==':') {
                if(arg_match && !*arg_str)
                    return true;
                else
                    return rtosc_match_args(pattern, msg); //retry
            }

            return arg_match;
        }